

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O1

void IT8951LoadImgStart(IT8951LdImgInfo *pstLdImgInfo)

{
  uint16_t uVar1;
  ushort uVar2;
  int iVar3;
  
  iVar3._0_2_ = pstLdImgInfo->usEndianType;
  iVar3._2_2_ = pstLdImgInfo->usPixelFormat;
  uVar1 = pstLdImgInfo->usPixelFormat;
  uVar2 = pstLdImgInfo->usRotate;
  LCDWriteCmdCode(0x20);
  LCDWriteData(uVar1 << 4 | (ushort)(iVar3 << 8) | uVar2);
  return;
}

Assistant:

void IT8951LoadImgStart(IT8951LdImgInfo* pstLdImgInfo)
{
    uint16_t usArg;
    //Setting Argument for Load image start
    usArg = (pstLdImgInfo->usEndianType << 8 )
    |(pstLdImgInfo->usPixelFormat << 4)
    |(pstLdImgInfo->usRotate);
    //Send Cmd
    LCDWriteCmdCode(IT8951_TCON_LD_IMG);
    //Send Arg
    LCDWriteData(usArg);
}